

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfp.c
# Opt level: O0

int sfp_get_active_cable_compliance(tcv_t *tcv,active_cable_compliance_t *compliance)

{
  sfp_plus_cable_technology_t local_25 [5];
  sfp_plus_cable_technology_t tech;
  active_cable_compliance_t *paStack_20;
  int ret;
  active_cable_compliance_t *compliance_local;
  tcv_t *tcv_local;
  
  if (((tcv == (tcv_t *)0x0) || (compliance == (active_cable_compliance_t *)0x0)) ||
     (tcv->data == (void *)0x0)) {
    tcv_local._4_4_ = -4;
  }
  else {
    paStack_20 = compliance;
    compliance_local = (active_cable_compliance_t *)tcv;
    tcv_local._4_4_ = tcv_get_sfp_plus_cable_technology(tcv,local_25);
    if (-1 < tcv_local._4_4_) {
      if ((local_25[0].bmp & 1) == 0) {
        tcv_local._4_4_ = -0xc;
      }
      else {
        paStack_20->bmp = 0;
        paStack_20->bmp =
             paStack_20->bmp & 0xfe |
             (*(byte *)(*(long *)(compliance_local + 0x20) + 0x3d) & 8) != 0;
        paStack_20->bmp =
             paStack_20->bmp & 0xfd |
             ((*(byte *)(*(long *)(compliance_local + 0x20) + 0x3d) & 4) != 0) << 1;
        paStack_20->bmp =
             paStack_20->bmp & 0xfb |
             ((*(byte *)(*(long *)(compliance_local + 0x20) + 0x3d) & 2) != 0) << 2;
        paStack_20->bmp =
             paStack_20->bmp & 0xf7 |
             ((*(byte *)(*(long *)(compliance_local + 0x20) + 0x3d) & 1) != 0) << 3;
        tcv_local._4_4_ = 0;
      }
    }
  }
  return tcv_local._4_4_;
}

Assistant:

int sfp_get_active_cable_compliance(tcv_t *tcv, active_cable_compliance_t *compliance)
{
	int ret;
	sfp_plus_cable_technology_t tech;

	if (tcv == NULL || compliance == NULL || tcv->data == NULL)
		return TCV_ERR_INVALID_ARG;

	ret = tcv_get_sfp_plus_cable_technology(tcv, &tech);
	if (ret < 0)
		return ret;

	/* Verify if the transceiver is passive cable */
	if (!tech.bits.active_cable)
		return TCV_ERR_FEATURE_NOT_AVAILABLE;

	/* Clear bitmap */
	compliance->bmp = 0;

	compliance->bits.fc_pi_4_limiting_compliant =
		!! (((sfp_data_t*)tcv->data)->a0[BASIC_INFO_REG_WAVELENGTH] & FC_PI_4_LIMITING_COMPLIANT);

	compliance->bits.sff_8431_limiting_compliant =
		!! (((sfp_data_t*)tcv->data)->a0[BASIC_INFO_REG_WAVELENGTH] & SFF_8431_LIMITING_COMPLIANT);

	compliance->bits.fc_pi_4_apndx_h_compliant =
		!! (((sfp_data_t*)tcv->data)->a0[BASIC_INFO_REG_WAVELENGTH] & FC_PI_4_APENDIX_H_COMPLIANT);

	compliance->bits.sff_8431_apndx_e_compliant =
		!! (((sfp_data_t*)tcv->data)->a0[BASIC_INFO_REG_WAVELENGTH] & SFF_8431_APENDIX_E_COMPLIANT);

	return 0;
}